

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratiotest.cpp
# Opt level: O3

RatiotestResult
ratiotest_textbook(Runtime *rt,QpVector *p,QpVector *rowmove,Instance *instance,double alphastart)

{
  double dVar1;
  double dVar2;
  int iVar3;
  undefined1 uVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  RatiotestResult RVar8;
  
  uVar4 = SUB81(p,0);
  if ((long)p->num_nz < 1) {
    iVar5 = -1;
  }
  else {
    dVar1 = (rt->settings).ratiotest_t;
    iVar5 = -1;
    lVar6 = 0;
    do {
      iVar3 = (p->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6];
      dVar2 = (p->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3];
      dVar7 = (instance->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3];
      if ((((dVar7 != -INFINITY) && (dVar2 < -dVar1)) ||
          ((dVar7 = (instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3], dVar7 != INFINITY && (dVar1 < dVar2))))
         && (dVar7 = (dVar7 - (rt->primal).value.super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar3]) / dVar2,
            dVar7 < alphastart)) {
        iVar5 = iVar3 + instance->num_con;
        uVar4 = dVar2 < 0.0;
        alphastart = dVar7;
      }
      lVar6 = lVar6 + 1;
    } while (p->num_nz != lVar6);
  }
  if (0 < (long)rowmove->num_nz) {
    dVar1 = (rt->settings).ratiotest_t;
    lVar6 = 0;
    do {
      iVar3 = (rowmove->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6];
      dVar2 = (rowmove->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3];
      dVar7 = (instance->con_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3];
      if ((((dVar7 != -INFINITY) && (dVar2 < -dVar1)) ||
          ((dVar7 = (instance->con_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3], dVar7 != INFINITY && (dVar1 < dVar2))))
         && (dVar7 = (dVar7 - (rt->rowactivity).value.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[iVar3]) / dVar2, dVar7 < alphastart))
      {
        uVar4 = dVar2 < 0.0;
        alphastart = dVar7;
        iVar5 = iVar3;
      }
      lVar6 = lVar6 + 1;
    } while (rowmove->num_nz != lVar6);
  }
  RVar8.nowactiveatlower = (bool)uVar4;
  RVar8.limitingconstraint = iVar5;
  RVar8.alpha = alphastart;
  RVar8._13_3_ = 0;
  return RVar8;
}

Assistant:

static RatiotestResult ratiotest_textbook(Runtime& rt, const QpVector& p,
                                          const QpVector& rowmove,
                                          Instance& instance,
                                          const double alphastart) {
  RatiotestResult result;
  result.limitingconstraint = -1;
  result.alpha = alphastart;

  // check ratio towards variable bounds
  for (HighsInt j = 0; j < p.num_nz; j++) {
    HighsInt i = p.index[j];
    double alpha_i = step(rt.primal.value[i], p.value[i], instance.var_lo[i],
                          instance.var_up[i], rt.settings.ratiotest_t);
    if (alpha_i < result.alpha) {
      result.alpha = alpha_i;
      result.limitingconstraint = instance.num_con + i;
      result.nowactiveatlower = p.value[i] < 0;
    }
  }

  // check ratio towards constraint bounds
  for (HighsInt j = 0; j < rowmove.num_nz; j++) {
    HighsInt i = rowmove.index[j];
    double alpha_i =
        step(rt.rowactivity.value[i], rowmove.value[i], instance.con_lo[i],
             instance.con_up[i], rt.settings.ratiotest_t);
    if (alpha_i < result.alpha) {
      result.alpha = alpha_i;
      result.limitingconstraint = i;
      result.nowactiveatlower = rowmove.value[i] < 0;
    }
  }

  return result;
}